

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O0

ON_ManifestMap_Hash32TableItem * __thiscall
ON_ManifestMap_SourceIdHash32Table::FirstManifestMapItemWithSourceId
          (ON_ManifestMap_SourceIdHash32Table *this,ON_UUID source_component_id)

{
  bool bVar1;
  ON__UINT32 hash32_00;
  ON_UUID *b;
  ON_ManifestMap_Hash32TableItem *local_38;
  ON_Hash32TableItem *hash_table_item;
  ON__UINT32 hash32;
  ON_ManifestMap_SourceIdHash32Table *this_local;
  ON_UUID source_component_id_local;
  
  source_component_id_local._0_8_ = source_component_id.Data4;
  this_local = source_component_id._0_8_;
  bVar1 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)&this_local);
  if (!bVar1) {
    hash32_00 = ON_ManifestMapItem::SourceIdHash32((ON_UUID *)&this_local);
    for (local_38 = (ON_ManifestMap_Hash32TableItem *)
                    ON_Hash32Table::FirstItemWithHash
                              (&(this->super_ON_ManifestMap_Hash32Table).super_ON_Hash32Table,
                               hash32_00); local_38 != (ON_ManifestMap_Hash32TableItem *)0x0;
        local_38 = (ON_ManifestMap_Hash32TableItem *)
                   ON_Hash32Table::NextItemWithHash
                             (&(this->super_ON_ManifestMap_Hash32Table).super_ON_Hash32Table,
                              &local_38->super_ON_Hash32TableItem)) {
      b = ON_ManifestMapItem::SourceId(&local_38->m_map_item);
      bVar1 = ::operator==((ON_UUID_struct *)&this_local,b);
      if (bVar1) {
        return local_38;
      }
    }
  }
  return (ON_ManifestMap_Hash32TableItem *)0x0;
}

Assistant:

const ON_ManifestMap_Hash32TableItem* FirstManifestMapItemWithSourceId(
    ON_UUID source_component_id
    ) const
  {
    if (ON_nil_uuid == source_component_id)
      return nullptr;
    const ON__UINT32 hash32 = ON_ManifestMapItem::SourceIdHash32(source_component_id);
    for (const ON_Hash32TableItem* hash_table_item = FirstItemWithHash(hash32); nullptr != hash_table_item; hash_table_item = NextItemWithHash(hash_table_item))
    {
      if (source_component_id == ((const ON_ManifestMap_Hash32TableItem*)hash_table_item)->m_map_item.SourceId() )
        return (const ON_ManifestMap_Hash32TableItem*)hash_table_item;
    }
    return nullptr;
  }